

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O2

void MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads(void)

{
  int iVar1;
  
  iVar1 = save_counter;
  save_counter = save_counter + 1;
  if (0 < iVar1) {
    return;
  }
  saved_operator_new_fptr = operator_new_fptr;
  saved_operator_new_nothrow_fptr = operator_new_nothrow_fptr;
  saved_operator_new_debug_fptr = operator_new_debug_fptr;
  saved_operator_new_array_fptr = operator_new_array_fptr;
  saved_operator_new_array_nothrow_fptr = operator_new_array_nothrow_fptr;
  saved_operator_new_array_debug_fptr = operator_new_array_debug_fptr;
  saved_operator_delete_fptr = operator_delete_fptr;
  saved_operator_delete_array_fptr = operator_delete_array_fptr;
  saved_malloc_fptr = malloc_fptr;
  saved_realloc_fptr = realloc_fptr;
  saved_free_fptr = free_fptr;
  turnOffNewDeleteOverloads();
  return;
}

Assistant:

void MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads()
{
#if CPPUTEST_USE_MEM_LEAK_DETECTION
    if (++save_counter > 1) return;
    saved_operator_new_fptr = operator_new_fptr;
    saved_operator_new_nothrow_fptr = operator_new_nothrow_fptr;
    saved_operator_new_debug_fptr = operator_new_debug_fptr;
    saved_operator_new_array_fptr = operator_new_array_fptr;
    saved_operator_new_array_nothrow_fptr = operator_new_array_nothrow_fptr;
    saved_operator_new_array_debug_fptr = operator_new_array_debug_fptr;
    saved_operator_delete_fptr = operator_delete_fptr;
    saved_operator_delete_array_fptr = operator_delete_array_fptr;
    saved_malloc_fptr = malloc_fptr;
    saved_realloc_fptr = realloc_fptr;
    saved_free_fptr = free_fptr;
    turnOffNewDeleteOverloads();
#endif
}